

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O1

void WebRtcIsac_InitMasking(MaskFiltstr *maskdata)

{
  memset(maskdata,0,0x1000);
  maskdata->CorrBufLo[0] = 0.0;
  maskdata->CorrBufLo[1] = 0.0;
  maskdata->CorrBufLo[2] = 0.0;
  maskdata->CorrBufLo[3] = 0.0;
  maskdata->CorrBufLo[4] = 0.0;
  maskdata->CorrBufLo[5] = 0.0;
  maskdata->CorrBufLo[6] = 0.0;
  maskdata->CorrBufLo[7] = 0.0;
  maskdata->CorrBufLo[8] = 0.0;
  maskdata->CorrBufLo[9] = 0.0;
  maskdata->CorrBufLo[10] = 0.0;
  maskdata->CorrBufLo[0xb] = 0.0;
  maskdata->CorrBufLo[0xc] = 0.0;
  maskdata->PreStateLoF[0] = 0.0;
  maskdata->PreStateLoF[1] = 0.0;
  maskdata->PreStateLoF[2] = 0.0;
  maskdata->PreStateLoF[3] = 0.0;
  maskdata->PreStateLoF[4] = 0.0;
  maskdata->PreStateLoF[5] = 0.0;
  maskdata->PreStateLoF[6] = 0.0;
  maskdata->PreStateLoF[7] = 0.0;
  maskdata->PreStateLoF[8] = 0.0;
  maskdata->PreStateLoF[9] = 0.0;
  maskdata->PreStateLoF[10] = 0.0;
  maskdata->PreStateLoF[0xb] = 0.0;
  *(undefined8 *)(maskdata->PreStateLoF + 0xc) = 0;
  maskdata->PreStateLoG[1] = 0.0;
  maskdata->PreStateLoG[2] = 0.0;
  maskdata->PreStateLoG[3] = 0.0;
  maskdata->PreStateLoG[4] = 0.0;
  maskdata->PreStateLoG[5] = 0.0;
  maskdata->PreStateLoG[6] = 0.0;
  maskdata->PreStateLoG[7] = 0.0;
  maskdata->PreStateLoG[8] = 0.0;
  maskdata->PreStateLoG[9] = 0.0;
  maskdata->PreStateLoG[10] = 0.0;
  maskdata->PreStateLoG[0xb] = 0.0;
  maskdata->PreStateLoG[0xc] = 0.0;
  maskdata->PostStateLoF[0] = 0.0;
  maskdata->PostStateLoF[1] = 0.0;
  maskdata->PostStateLoF[2] = 0.0;
  maskdata->PostStateLoF[3] = 0.0;
  maskdata->PostStateLoF[4] = 0.0;
  maskdata->PostStateLoF[5] = 0.0;
  maskdata->PostStateLoF[6] = 0.0;
  maskdata->PostStateLoF[7] = 0.0;
  maskdata->PostStateLoF[8] = 0.0;
  maskdata->PostStateLoF[9] = 0.0;
  maskdata->PostStateLoF[10] = 0.0;
  maskdata->PostStateLoF[0xb] = 0.0;
  *(undefined8 *)(maskdata->PostStateLoF + 0xc) = 0;
  maskdata->PostStateLoG[1] = 0.0;
  maskdata->PostStateLoG[2] = 0.0;
  maskdata->PostStateLoG[3] = 0.0;
  maskdata->PostStateLoG[4] = 0.0;
  maskdata->PostStateLoG[5] = 0.0;
  maskdata->PostStateLoG[6] = 0.0;
  maskdata->PostStateLoG[7] = 0.0;
  maskdata->PostStateLoG[8] = 0.0;
  maskdata->PostStateLoG[9] = 0.0;
  maskdata->PostStateLoG[10] = 0.0;
  maskdata->PostStateLoG[0xb] = 0.0;
  maskdata->PostStateLoG[0xc] = 0.0;
  maskdata->CorrBufHi[6] = 0.0;
  maskdata->CorrBufHi[4] = 0.0;
  maskdata->CorrBufHi[5] = 0.0;
  maskdata->CorrBufHi[2] = 0.0;
  maskdata->CorrBufHi[3] = 0.0;
  maskdata->CorrBufHi[0] = 0.0;
  maskdata->CorrBufHi[1] = 0.0;
  maskdata->PreStateHiG[5] = 0.0;
  maskdata->PreStateHiG[6] = 0.0;
  maskdata->PreStateHiG[1] = 0.0;
  maskdata->PreStateHiG[2] = 0.0;
  maskdata->PreStateHiG[3] = 0.0;
  maskdata->PreStateHiG[4] = 0.0;
  maskdata->PreStateHiF[4] = 0.0;
  maskdata->PreStateHiF[5] = 0.0;
  *(undefined8 *)(maskdata->PreStateHiF + 6) = 0;
  maskdata->PreStateHiF[0] = 0.0;
  maskdata->PreStateHiF[1] = 0.0;
  maskdata->PreStateHiF[2] = 0.0;
  maskdata->PreStateHiF[3] = 0.0;
  maskdata->PostStateHiG[5] = 0.0;
  maskdata->PostStateHiG[6] = 0.0;
  maskdata->PostStateHiG[1] = 0.0;
  maskdata->PostStateHiG[2] = 0.0;
  maskdata->PostStateHiG[3] = 0.0;
  maskdata->PostStateHiG[4] = 0.0;
  maskdata->PostStateHiF[4] = 0.0;
  maskdata->PostStateHiF[5] = 0.0;
  *(undefined8 *)(maskdata->PostStateHiF + 6) = 0;
  maskdata->PostStateHiF[0] = 0.0;
  maskdata->PostStateHiF[1] = 0.0;
  maskdata->PostStateHiF[2] = 0.0;
  maskdata->PostStateHiF[3] = 0.0;
  maskdata->OldEnergy = 10.0;
  return;
}

Assistant:

void WebRtcIsac_InitMasking(MaskFiltstr *maskdata) {

  int k;

  for (k = 0; k < WINLEN; k++) {
    maskdata->DataBufferLo[k] = 0.0;
    maskdata->DataBufferHi[k] = 0.0;
  }
  for (k = 0; k < ORDERLO+1; k++) {
    maskdata->CorrBufLo[k] = 0.0;
    maskdata->PreStateLoF[k] = 0.0;
    maskdata->PreStateLoG[k] = 0.0;
    maskdata->PostStateLoF[k] = 0.0;
    maskdata->PostStateLoG[k] = 0.0;
  }
  for (k = 0; k < ORDERHI+1; k++) {
    maskdata->CorrBufHi[k] = 0.0;
    maskdata->PreStateHiF[k] = 0.0;
    maskdata->PreStateHiG[k] = 0.0;
    maskdata->PostStateHiF[k] = 0.0;
    maskdata->PostStateHiG[k] = 0.0;
  }

  maskdata->OldEnergy = 10.0;
  return;
}